

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.hpp
# Opt level: O0

void __thiscall antlr::TokenBuffer::syncConsume(TokenBuffer *this)

{
  long in_RDI;
  size_t in_stack_00000028;
  CircularQueue<antlr::TokenRefCount<antlr::Token>_> *in_stack_00000030;
  
  if (*(int *)(in_RDI + 0x18) != 0) {
    if (*(int *)(in_RDI + 0x10) == 0) {
      CircularQueue<antlr::TokenRefCount<antlr::Token>_>::removeItems
                (in_stack_00000030,in_stack_00000028);
    }
    else {
      *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x18) + *(int *)(in_RDI + 0x14);
    }
    *(undefined4 *)(in_RDI + 0x18) = 0;
  }
  return;
}

Assistant:

inline void TokenBuffer::syncConsume()
{
	if (numToConsume > 0)
	{
		if (nMarkers > 0)
			markerOffset += numToConsume;
		else
			queue.removeItems( numToConsume );

		numToConsume = 0;
	}
}